

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePaddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  PaddingLayerParams *pPVar2;
  BorderAmounts *pBVar3;
  undefined1 local_e0 [40];
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_e0,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_e0);
  std::__cxx11::string::~string((string *)(local_e0 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_e0,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string((string *)&local_38,"Padding",(allocator *)&err);
    validateInputOutputRankEquality((Result *)local_e0,layer,&local_38,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&err,"Padding",(allocator *)&local_98);
    validateRankCount((Result *)local_e0,layer,&err,2,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)&err);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pPVar2 = Specification::NeuralNetworkLayer::padding(layer);
  pBVar3 = pPVar2->paddingamounts_;
  if (pBVar3 == (BorderAmounts *)0x0) {
    pBVar3 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
  }
  if (((pBVar3->borderamounts_).super_RepeatedPtrFieldBase.current_size_ & 0xfffffffdU) == 0) {
    if (pPVar2->_oneof_case_[0] != 0) {
      return __return_storage_ptr__;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   "Padding layer ",(layer->name_).ptr_);
    std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e0," padding type is not set.");
    std::__cxx11::string::~string((string *)local_e0);
    Result::Result((Result *)local_e0,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    std::operator+(&local_58,"Padding layer ",(layer->name_).ptr_);
    std::operator+(&local_98,&local_58," specifies ");
    pBVar3 = pPVar2->paddingamounts_;
    if (pBVar3 == (BorderAmounts *)0x0) {
      pBVar3 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    std::__cxx11::to_string
              (&local_78,(pBVar3->borderamounts_).super_RepeatedPtrFieldBase.current_size_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   &local_98,&local_78);
    std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e0,
                   " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values."
                  );
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    Result::Result((Result *)local_e0,INVALID_MODEL_PARAMETERS,&err);
  }
  Result::operator=(__return_storage_ptr__,(Result *)local_e0);
  std::__cxx11::string::~string((string *)(local_e0 + 8));
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePaddingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Padding", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Padding", 2, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.padding();
    if (!(params.paddingamounts().borderamounts_size() == 0
          || params.paddingamounts().borderamounts_size() == 2)) {
        std::string err = "Padding layer " + layer.name() + " specifies " + std::to_string(params.paddingamounts().borderamounts_size()) + " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (params.PaddingType_case() == Specification::PaddingLayerParams::PaddingTypeCase::PADDINGTYPE_NOT_SET) {
        std::string err = "Padding layer " + layer.name() + " padding type is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}